

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.h
# Opt level: O0

void __thiscall dynet::RNNStateMachine::transition(RNNStateMachine *this,RNNOp op)

{
  int iVar1;
  int in_ESI;
  int *in_RDI;
  RNNOp in_stack_000001cc;
  RNNStateMachine *in_stack_000001d0;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    if (in_ESI == 0) {
      *in_RDI = 1;
      return;
    }
    failure(in_stack_000001d0,in_stack_000001cc);
  }
  else if (iVar1 != 1) {
    if (iVar1 != 2) {
      return;
    }
    goto LAB_00dc7cb1;
  }
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI == 1) {
    *in_RDI = 2;
    return;
  }
  failure(in_stack_000001d0,in_stack_000001cc);
LAB_00dc7cb1:
  if ((in_ESI != 2) && (in_ESI != 1)) {
    if (in_ESI == 0) {
      *in_RDI = 1;
    }
    else {
      failure(in_stack_000001d0,in_stack_000001cc);
    }
  }
  return;
}

Assistant:

void transition(RNNOp op) {
    switch (q_) {
      case RNNState::CREATED:
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
      case RNNState::GRAPH_READY:
        if (op == RNNOp::new_graph) { break; }
        if (op == RNNOp::start_new_sequence) { q_ = RNNState::READING_INPUT; break; }
        failure(op);
      case RNNState::READING_INPUT:
        if (op == RNNOp::add_input) { break; }
        if (op == RNNOp::start_new_sequence) { break; }
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
    }
  }